

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap_lock.c
# Opt level: O2

ALLEGRO_LOCKED_REGION *
al_lock_bitmap_region_blocked
          (ALLEGRO_BITMAP *bitmap,int x_block,int y_block,int width_block,int height_block,int flags
          )

{
  _Bool _Var1;
  int format;
  int iVar2;
  int iVar3;
  ALLEGRO_LOCKED_REGION *pAVar4;
  
  format = al_get_bitmap_format(bitmap);
  al_get_bitmap_flags(bitmap);
  iVar2 = al_get_pixel_block_width(format);
  iVar3 = al_get_pixel_block_height(format);
  if ((iVar3 == 1 && iVar2 == 1) && (_Var1 = _al_pixel_format_is_video_only(format), !_Var1)) {
    pAVar4 = al_lock_bitmap_region(bitmap,x_block,y_block,width_block,height_block,format,flags);
    return pAVar4;
  }
  if (bitmap->parent != (ALLEGRO_BITMAP *)0x0) {
    if (bitmap->xofs % iVar2 != 0) {
      return (ALLEGRO_LOCKED_REGION *)0x0;
    }
    if (bitmap->yofs % iVar3 != 0) {
      return (ALLEGRO_LOCKED_REGION *)0x0;
    }
    x_block = x_block + bitmap->xofs / iVar2;
    y_block = y_block + bitmap->yofs / iVar3;
    bitmap = bitmap->parent;
  }
  if (bitmap->locked == false) {
    if ((flags & 1U) == 0) {
      bitmap->dirty = true;
    }
    bitmap->lock_x = x_block * iVar2;
    bitmap->lock_y = y_block * iVar3;
    bitmap->lock_w = width_block * iVar2;
    bitmap->lock_h = height_block * iVar3;
    bitmap->lock_flags = flags;
    pAVar4 = (*bitmap->vt->lock_compressed_region)
                       (bitmap,x_block * iVar2,y_block * iVar3,width_block * iVar2,
                        height_block * iVar3,flags);
    if (pAVar4 != (ALLEGRO_LOCKED_REGION *)0x0) {
      bitmap->locked = true;
      return pAVar4;
    }
  }
  return (ALLEGRO_LOCKED_REGION *)0x0;
}

Assistant:

ALLEGRO_LOCKED_REGION *al_lock_bitmap_region_blocked(ALLEGRO_BITMAP *bitmap,
   int x_block, int y_block, int width_block, int height_block, int flags)
{
   ALLEGRO_LOCKED_REGION *lr;
   int bitmap_format = al_get_bitmap_format(bitmap);
   int bitmap_flags = al_get_bitmap_flags(bitmap);
   int block_width = al_get_pixel_block_width(bitmap_format);
   int block_height = al_get_pixel_block_height(bitmap_format);
   ASSERT(x_block >= 0);
   ASSERT(y_block >= 0);
   ASSERT(width_block >= 0);
   ASSERT(height_block >= 0);

   if (block_width == 1 && block_height == 1 && !_al_pixel_format_is_video_only(bitmap_format)) {
      return al_lock_bitmap_region(bitmap, x_block, y_block, width_block,
         height_block, bitmap_format, flags);
   }

   /* Currently, this is the only format that gets to this point */
   ASSERT(_al_pixel_format_is_compressed(bitmap_format));
   ASSERT(!(bitmap_flags & ALLEGRO_MEMORY_BITMAP));

   /* For sub-bitmaps */
   if (bitmap->parent) {
      if (bitmap->xofs % block_width != 0 ||
          bitmap->yofs % block_height != 0) {
         return NULL;
      }
      x_block += bitmap->xofs / block_width;
      y_block += bitmap->yofs / block_height;
      bitmap = bitmap->parent;
   }

   if (bitmap->locked)
      return NULL;

   if (!(flags & ALLEGRO_LOCK_READONLY))
      bitmap->dirty = true;

   ASSERT(x_block + width_block
      <= _al_get_least_multiple(bitmap->w, block_width) / block_width);
   ASSERT(y_block + height_block
      <= _al_get_least_multiple(bitmap->h, block_height) / block_height);

   bitmap->lock_x = x_block * block_width;
   bitmap->lock_y = y_block * block_height;
   bitmap->lock_w = width_block * block_width;
   bitmap->lock_h = height_block * block_height;
   bitmap->lock_flags = flags;

   lr = bitmap->vt->lock_compressed_region(bitmap, bitmap->lock_x,
      bitmap->lock_y, bitmap->lock_w, bitmap->lock_h, flags);
   if (!lr) {
      return NULL;
   }

   bitmap->locked = true;

   return lr;
}